

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlattribute.cpp
# Opt level: O3

XmlAttributePtr __thiscall libcellml::XmlAttribute::next(XmlAttribute *this)

{
  void *pvVar1;
  XmlAttribute *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  XmlAttributePtr XVar2;
  undefined1 local_29;
  XmlAttribute local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  pvVar1 = *(void **)(*(long *)*in_RSI + 0x30);
  this->mPimpl = (XmlAttributeImpl *)0x0;
  this[1].mPimpl = (XmlAttributeImpl *)0x0;
  if (pvVar1 != (void *)0x0) {
    local_28.mPimpl = (XmlAttributeImpl *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libcellml::XmlAttribute,std::allocator<libcellml::XmlAttribute>>
              (&local_20,(XmlAttribute **)&local_28,(allocator<libcellml::XmlAttribute> *)&local_29)
    ;
    this->mPimpl = (XmlAttributeImpl *)local_28;
    this[1].mPimpl = (XmlAttributeImpl *)local_20._M_pi;
    (local_28.mPimpl)->mXmlAttributePtr->_private = pvVar1;
    in_RDX._M_pi = extraout_RDX;
  }
  XVar2.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  XVar2.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (XmlAttributePtr)
         XVar2.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlAttributePtr XmlAttribute::next() const
{
    xmlAttrPtr next = mPimpl->mXmlAttributePtr->next;
    XmlAttributePtr nextHandle = nullptr;
    if (next != nullptr) {
        nextHandle = std::make_shared<XmlAttribute>();
        nextHandle->setXmlAttribute(next);
    }
    return nextHandle;
}